

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O2

uint16 crnd::dxt1_block::pack_color(color_quad_u8 *color,bool scaled,uint32 bias)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  undefined7 in_register_00000031;
  uint uVar6;
  uint uVar7;
  
  bVar1 = (color->field_0).field_0.r;
  uVar4 = (uint)bVar1;
  bVar2 = (color->field_0).field_0.g;
  uVar7 = (uint)bVar2;
  bVar3 = (color->field_0).field_0.b;
  uVar6 = (uint)bVar3;
  if ((int)CONCAT71(in_register_00000031,scaled) != 0) {
    uVar4 = ((uint)bVar1 * 0x1f + bias) / 0xff;
    uVar7 = ((uint)bVar2 * 0x3f + bias) / 0xff;
    uVar6 = ((uint)bVar3 * 0x1f + bias) / 0xff;
  }
  if (0x1e < uVar4) {
    uVar4 = 0x1f;
  }
  uVar5 = 0x3f;
  if (uVar7 < 0x3f) {
    uVar5 = uVar7;
  }
  uVar7 = 0x1f;
  if (uVar6 < 0x1f) {
    uVar7 = uVar6;
  }
  return (ushort)(uVar4 << 0xb) | (ushort)(uVar5 << 5) | (ushort)uVar7;
}

Assistant:

uint16 dxt1_block::pack_color(const color_quad_u8& color, bool scaled, uint32 bias)
    {
        uint32 r = color.r;
        uint32 g = color.g;
        uint32 b = color.b;

        if (scaled)
        {
            r = (r * 31U + bias) / 255U;
            g = (g * 63U + bias) / 255U;
            b = (b * 31U + bias) / 255U;
        }

        r = math::minimum(r, 31U);
        g = math::minimum(g, 63U);
        b = math::minimum(b, 31U);

        return static_cast<uint16>(b | (g << 5U) | (r << 11U));
    }